

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O3

SRes Lzma2Dec_AllocateProbs(CLzma2Dec *p,Byte prop,ISzAlloc *alloc)

{
  SRes SVar1;
  Byte props [5];
  Byte local_5 [5];
  
  SVar1 = 4;
  if (prop < 0x29) {
    SVar1 = LzmaDec_AllocateProbs(&p->decoder,local_5,5,alloc);
  }
  return SVar1;
}

Assistant:

SRes Lzma2Dec_AllocateProbs(CLzma2Dec *p, Byte prop, ISzAlloc *alloc)
{
  Byte props[LZMA_PROPS_SIZE];
  RINOK(Lzma2Dec_GetOldProps(prop, props));
  return LzmaDec_AllocateProbs(&p->decoder, props, LZMA_PROPS_SIZE, alloc);
}